

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ai.cxx
# Opt level: O2

bool __thiscall xray_re::xr_level_ai::load(xr_level_ai *this,char *key,char *name)

{
  bool bVar1;
  xr_file_system *this_00;
  xr_reader *r;
  
  this_00 = xr_file_system::instance();
  r = xr_file_system::r_open(this_00,key,name);
  if (r != (xr_reader *)0x0) {
    load(this,r);
    bVar1 = xr_reader::eof(r);
    if (!bVar1) {
      __assert_fail("r->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_ai.cxx"
                    ,0x79,"bool xray_re::xr_level_ai::load(const char *, const char *)");
    }
    (*r->_vptr_xr_reader[1])(r);
  }
  return r != (xr_reader *)0x0;
}

Assistant:

bool xr_level_ai::load(const char* key, const char* name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(key, name);
	if (r == 0)
		return false;
	load(*r);
	assert(r->eof());
	fs.r_close(r);
	return true;
}